

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3_uri_parameter(char *zFilename,char *zParam)

{
  uint uVar1;
  int iVar2;
  char *__s1;
  
  if (zParam == (char *)0x0 || zFilename == (char *)0x0) {
LAB_001211d1:
    zFilename = (char *)0x0;
  }
  else {
    do {
      uVar1 = sqlite3Strlen30(zFilename);
      if (zFilename[(ulong)uVar1 + 1] == '\0') goto LAB_001211d1;
      __s1 = zFilename + (ulong)uVar1 + 1;
      iVar2 = strcmp(__s1,zParam);
      uVar1 = sqlite3Strlen30(__s1);
      zFilename = __s1 + (ulong)uVar1 + 1;
    } while (iVar2 != 0);
  }
  return zFilename;
}

Assistant:

SQLITE_API const char *sqlite3_uri_parameter(const char *zFilename, const char *zParam){
  if( zFilename==0 || zParam==0 ) return 0;
  zFilename += sqlite3Strlen30(zFilename) + 1;
  while( zFilename[0] ){
    int x = strcmp(zFilename, zParam);
    zFilename += sqlite3Strlen30(zFilename) + 1;
    if( x==0 ) return zFilename;
    zFilename += sqlite3Strlen30(zFilename) + 1;
  }
  return 0;
}